

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O2

void __thiscall EventLoop::quit(EventLoop *this)

{
  bool bVar1;
  
  this->el_quit = true;
  bVar1 = is_in_loop_thread(this);
  if (bVar1) {
    return;
  }
  evfd_wakeup(this);
  return;
}

Assistant:

void EventLoop::quit() {
    el_quit = true;
    if (!is_in_loop_thread()) {
        evfd_wakeup();
    }
}